

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split-options.cpp
# Opt level: O1

bool __thiscall wasm::WasmSplitOptions::validate(WasmSplitOptions *this)

{
  Mode *mode;
  pointer pbVar1;
  WasmSplitOptions *pWVar2;
  const_iterator cVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  pointer __k;
  bool bVar7;
  stringstream local_1e0 [8];
  stringstream msg;
  ostream local_1d0 [112];
  ios_base local_160 [264];
  WasmSplitOptions *local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  bVar7 = (this->inputFiles).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->inputFiles).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  if (!bVar7) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: ",7);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"no input file",0xd);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  }
  if (this->mode < MergeProfiles) {
    if ((ulong)((long)(this->inputFiles).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->inputFiles).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) < 0x21) goto LAB_00117ed4;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: ",7);
    pcVar6 = "Cannot have more than one input file.";
    lVar5 = 0x25;
  }
  else {
    if ((this->mode != PrintProfile) ||
       ((long)(this->inputFiles).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->inputFiles).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0x20)) goto LAB_00117ed4;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: ",7);
    pcVar6 = "Must have exactly one profile path.";
    lVar5 = 0x23;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar6,lVar5);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
  bVar7 = false;
LAB_00117ed4:
  mode = &this->mode;
  pbVar1 = (this->usedOptions).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pWVar2 = this;
  for (__k = (this->usedOptions).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start; local_58 = pWVar2, __k != pbVar1;
      __k = __k + 1) {
    cVar3 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find(&(this->validOptions)._M_elems[*mode]._M_h,__k);
    if (cVar3.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::__cxx11::stringstream::stringstream(local_1e0);
      std::__ostream_insert<char,std::char_traits<char>>(local_1d0,"Option ",7);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1d0,(__k->_M_dataplus)._M_p,__k->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," cannot be used in ",0x13);
      anon_unknown_12::operator<<(poVar4,mode);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4," mode.",6);
      std::__cxx11::stringbuf::str();
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: ",7);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,(char *)local_50,local_48);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
      std::__cxx11::stringstream::~stringstream(local_1e0);
      std::ios_base::~ios_base(local_160);
      bVar7 = false;
    }
    pWVar2 = local_58;
  }
  if (*mode == Split) {
    if (((pWVar2->profileFile)._M_string_length != 0) &&
       ((pWVar2->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: ",7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Cannot use both --profile and --keep-funcs.",0x2b);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
      bVar7 = false;
    }
    if (((pWVar2->profileFile)._M_string_length != 0) &&
       ((pWVar2->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: ",7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Cannot use both --profile and --split-funcs.",0x2c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
      bVar7 = false;
    }
    if (((pWVar2->keepFuncs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) &&
       ((pWVar2->splitFuncs)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"error: ",7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Cannot use both --keep-funcs and --split-funcs.",0x2f);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"\n",1);
      bVar7 = false;
    }
  }
  return bVar7;
}

Assistant:

bool WasmSplitOptions::validate() {
  bool valid = true;
  auto fail = [&](auto msg) {
    std::cerr << "error: " << msg << "\n";
    valid = false;
  };

  // Validate the positional arguments.
  if (inputFiles.size() == 0) {
    fail("no input file");
  }
  switch (mode) {
    case Mode::Split:
    case Mode::Instrument:
      if (inputFiles.size() > 1) {
        fail("Cannot have more than one input file.");
      }
      break;
    case Mode::MergeProfiles:
      // Any number >= 1 allowed.
      break;
    case Mode::PrintProfile:
      if (inputFiles.size() != 1) {
        fail("Must have exactly one profile path.");
      }
      break;
  }

  // Validate that all used options are allowed in the current mode.
  for (std::string& opt : usedOptions) {
    if (!validOptions[static_cast<unsigned>(mode)].count(opt)) {
      std::stringstream msg;
      msg << "Option " << opt << " cannot be used in " << mode << " mode.";
      fail(msg.str());
    }
  }

  if (mode == Mode::Split) {
    if (profileFile.size() && keepFuncs.size()) {
      fail("Cannot use both --profile and --keep-funcs.");
    }
    if (profileFile.size() && splitFuncs.size()) {
      fail("Cannot use both --profile and --split-funcs.");
    }
    if (keepFuncs.size() && splitFuncs.size()) {
      fail("Cannot use both --keep-funcs and --split-funcs.");
    }
  }

  return valid;
}